

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_lnx_UdevEnumerate.h
# Opt level: O1

bool __thiscall axl::sys::lnx::UdevEnumerate::create(UdevEnumerate *this,udev *ctx)

{
  udev_enumerate *puVar1;
  
  puVar1 = (udev_enumerate *)(*(code *)libudev::udev_enumerate_new)(ctx);
  if ((this->
      super_Handle<axl::sys::lnx::libudev::udev_enumerate_*,_axl::sys::lnx::UnrefUdevEnumerate,_axl::sl::Zero<axl::sys::lnx::libudev::udev_enumerate_*>_>
      ).m_h != (udev_enumerate *)0x0) {
    (*(code *)libudev::udev_enumerate_unref)();
    (this->
    super_Handle<axl::sys::lnx::libudev::udev_enumerate_*,_axl::sys::lnx::UnrefUdevEnumerate,_axl::sl::Zero<axl::sys::lnx::libudev::udev_enumerate_*>_>
    ).m_h = (udev_enumerate *)0x0;
  }
  (this->
  super_Handle<axl::sys::lnx::libudev::udev_enumerate_*,_axl::sys::lnx::UnrefUdevEnumerate,_axl::sl::Zero<axl::sys::lnx::libudev::udev_enumerate_*>_>
  ).m_h = puVar1;
  if (puVar1 == (udev_enumerate *)0x0) {
    err::setFormatStringError("libudev failed: %s","udev_enumerate_new");
  }
  return puVar1 != (udev_enumerate *)0x0;
}

Assistant:

bool
	create(udev* ctx) {
		attach(udev_enumerate_new(ctx));
		return completeUdev(m_h, "udev_enumerate_new");
	}